

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O3

void __thiscall
btBoxShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btBoxShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btScalar bVar1;
  undefined8 uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (0 < numVectors) {
    lVar3 = 0;
    do {
      uVar4 = -(uint)(0.0 <= *(float *)((long)vectors->m_floats + lVar3 + 8));
      bVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
              m_implicitShapeDimensions.m_floats[2];
      uVar2 = *(undefined8 *)((long)vectors->m_floats + lVar3);
      uVar5 = -(uint)(0.0 <= (float)uVar2);
      uVar6 = -(uint)(0.0 <= (float)((ulong)uVar2 >> 0x20));
      uVar2 = *(undefined8 *)
               (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
               m_implicitShapeDimensions.m_floats;
      uVar7 = (uint)uVar2;
      uVar8 = (uint)((ulong)uVar2 >> 0x20);
      *(ulong *)((long)supportVerticesOut->m_floats + lVar3) =
           CONCAT44(~uVar6 & (uVar8 ^ 0x80000000),~uVar5 & (uVar7 ^ 0x80000000)) |
           CONCAT44(uVar8 & uVar6,uVar7 & uVar5);
      *(uint *)((long)supportVerticesOut->m_floats + lVar3 + 8) =
           ~uVar4 & (uint)-bVar1 | uVar4 & (uint)bVar1;
      *(undefined4 *)((long)supportVerticesOut->m_floats + lVar3 + 0xc) = 0;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)numVectors << 4 != lVar3);
  }
  return;
}

Assistant:

virtual void	batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
	{
		const btVector3& halfExtents = getHalfExtentsWithoutMargin();
	
		for (int i=0;i<numVectors;i++)
		{
			const btVector3& vec = vectors[i];
			supportVerticesOut[i].setValue(btFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
				btFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
				btFsels(vec.z(), halfExtents.z(), -halfExtents.z())); 
		}

	}